

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

SFormat lj_strfmt_parse(FormatState *fs)

{
  byte bVar1;
  uint8_t *puVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint32_t sx;
  uint32_t prec;
  uint32_t width;
  uint32_t c;
  SFormat sf;
  uint8_t *e;
  uint8_t *p;
  FormatState *fs_local;
  uint local_4;
  
  p = fs->p;
  fs->str = (char *)p;
  do {
    if (fs->e <= p) {
LAB_0011f6ae:
      fs->p = p;
LAB_0011f6bb:
      fs->len = (int)p - (int)fs->str;
      if (fs->len == 0) {
        return 0;
      }
      return 2;
    }
    if (*p == '%') {
      if (p[1] == '%') {
        fs->p = p + 2;
        p = p + 1;
        goto LAB_0011f6bb;
      }
      sf = 0;
      puVar2 = p;
      if (p == (uint8_t *)fs->str) break;
      goto LAB_0011f6ae;
    }
    p = p + 1;
  } while( true );
LAB_0011f407:
  p = puVar2 + 1;
  if (0x10 < *p - 0x20) {
LAB_0011f4c6:
    if (*p - 0x30 < 10) {
      pbVar4 = puVar2 + 2;
      width = *p - 0x30;
      p = pbVar4;
      if (*pbVar4 - 0x30 < 10) {
        p = puVar2 + 3;
        width = (*pbVar4 - 0x30) + width * 10;
      }
      sf = width << 0x10 | sf;
    }
    if (*p == '.') {
      prec = 0;
      pbVar4 = p + 1;
      if (*pbVar4 - 0x30 < 10) {
        pbVar5 = p + 2;
        prec = *pbVar4 - 0x30;
        pbVar4 = pbVar5;
        if (*pbVar5 - 0x30 < 10) {
          prec = (*pbVar5 - 0x30) + prec * 10;
          pbVar4 = p + 3;
        }
      }
      p = pbVar4;
      sf = (prec + 1) * 0x1000000 | sf;
    }
    uVar3 = *p - 0x41;
    if ((uVar3 < 0x38) && (bVar1 = "\x05"[uVar3], bVar1 != 0)) {
      fs->p = p + 1;
      local_4 = 0x2000;
      if ((uVar3 & 0x20) != 0) {
        local_4 = 0;
      }
      local_4 = sf | bVar1 | local_4;
    }
    else {
      if (0x1f < *p) {
        p = p + 1;
      }
      fs->len = (int)p - (int)fs->str;
      fs->p = fs->e;
      local_4 = 1;
    }
    return local_4;
  }
  if (*p == '-') {
    sf = sf | 0x100;
    puVar2 = p;
  }
  else if (*p == '+') {
    sf = sf | 0x200;
    puVar2 = p;
  }
  else if (*p == '0') {
    sf = sf | 0x400;
    puVar2 = p;
  }
  else if (*p == ' ') {
    sf = sf | 0x800;
    puVar2 = p;
  }
  else {
    if (*p != '#') goto LAB_0011f4c6;
    sf = sf | 0x1000;
    puVar2 = p;
  }
  goto LAB_0011f407;
}

Assistant:

SFormat LJ_FASTCALL lj_strfmt_parse(FormatState *fs)
{
  const uint8_t *p = fs->p, *e = fs->e;
  fs->str = (const char *)p;
  for (; p < e; p++) {
    if (*p == '%') {  /* Escape char? */
      if (p[1] == '%') {  /* '%%'? */
	fs->p = ++p+1;
	goto retlit;
      } else {
	SFormat sf = 0;
	uint32_t c;
	if (p != (const uint8_t *)fs->str)
	  break;
	for (p++; (uint32_t)*p - ' ' <= (uint32_t)('0' - ' '); p++) {
	  /* Parse flags. */
	  if (*p == '-') sf |= STRFMT_F_LEFT;
	  else if (*p == '+') sf |= STRFMT_F_PLUS;
	  else if (*p == '0') sf |= STRFMT_F_ZERO;
	  else if (*p == ' ') sf |= STRFMT_F_SPACE;
	  else if (*p == '#') sf |= STRFMT_F_ALT;
	  else break;
	}
	if ((uint32_t)*p - '0' < 10) {  /* Parse width. */
	  uint32_t width = (uint32_t)*p++ - '0';
	  if ((uint32_t)*p - '0' < 10)
	    width = (uint32_t)*p++ - '0' + width*10;
	  sf |= (width << STRFMT_SH_WIDTH);
	}
	if (*p == '.') {  /* Parse precision. */
	  uint32_t prec = 0;
	  p++;
	  if ((uint32_t)*p - '0' < 10) {
	    prec = (uint32_t)*p++ - '0';
	    if ((uint32_t)*p - '0' < 10)
	      prec = (uint32_t)*p++ - '0' + prec*10;
	  }
	  sf |= ((prec+1) << STRFMT_SH_PREC);
	}
	/* Parse conversion. */
	c = (uint32_t)*p - 'A';
	if (LJ_LIKELY(c <= (uint32_t)('x' - 'A'))) {
	  uint32_t sx = strfmt_map[c];
	  if (sx) {
	    fs->p = p+1;
	    return (sf | sx | ((c & 0x20) ? 0 : STRFMT_F_UPPER));
	  }
	}
	/* Return error location. */
	if (*p >= 32) p++;
	fs->len = (MSize)(p - (const uint8_t *)fs->str);
	fs->p = fs->e;
	return STRFMT_ERR;
      }
    }
  }
  fs->p = p;
retlit:
  fs->len = (MSize)(p - (const uint8_t *)fs->str);
  return fs->len ? STRFMT_LIT : STRFMT_EOF;
}